

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obsolete_vertex_with_color.c
# Opt level: O3

bool_t prf_obsolete_vertex_with_color_save_f(prf_node_t *node,prf_state_t *state,bfile_t *bfile)

{
  uint32_t *puVar1;
  bool_t bVar2;
  
  if (node->opcode == prf_obsolete_vertex_with_color_info.opcode) {
    bf_put_uint16_be(bfile,node->opcode);
    bf_put_uint16_be(bfile,node->length);
    puVar1 = (uint32_t *)node->data;
    bf_put_uint32_be(bfile,*puVar1);
    bf_put_uint32_be(bfile,puVar1[1]);
    bf_put_uint32_be(bfile,puVar1[2]);
    bVar2 = 1;
    if (0x10 < node->length) {
      bf_write(bfile,node->data + 0xc,node->length - 0x10);
    }
  }
  else {
    bVar2 = 0;
    prf_error(9,"tried vertex with color (obs) save method for node of type %d.");
  }
  return bVar2;
}

Assistant:

static
bool_t
prf_obsolete_vertex_with_color_save_f(
    prf_node_t * node,
    prf_state_t * state,
    bfile_t * bfile )
{
    int pos = 4;
    assert( node != NULL && state != NULL && bfile != NULL );

    if ( node->opcode != prf_obsolete_vertex_with_color_info.opcode ) {
        prf_error( 9,
            "tried vertex with color (obs) save method for node of type %d.",
            node->opcode );
        return FALSE;
    }

    bf_put_uint16_be( bfile, node->opcode );
    bf_put_uint16_be( bfile, node->length );

    do {
        node_data * data;
        data = (node_data *) node->data;
        assert( data != NULL );
        bf_put_uint32_be( bfile, data->x ); pos += 4;
        bf_put_uint32_be( bfile, data->y ); pos += 4;
        bf_put_uint32_be( bfile, data->z ); pos += 4;
    } while ( FALSE );

    if ( node->length > pos )
        pos += bf_write( bfile, node->data + pos - 4 + NODE_DATA_PAD,
            node->length - pos );

    return TRUE;
}